

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_valueiterator.cpp
# Opt level: O2

Value __thiscall Json::ValueIteratorBase::key(ValueIteratorBase *this)

{
  undefined8 extraout_RDX;
  long *in_RSI;
  Value VVar1;
  CZString czstring;
  CZString local_20;
  
  Value::CZString::CZString(&local_20,(CZString *)(*in_RSI + 0x20));
  if ((_Base_ptr)local_20.cstr_ == (_Base_ptr)0x0) {
    this->isNull_ = true;
    *(int *)&(this->current_)._M_node = local_20.index_;
  }
  else if (local_20.index_ == 0) {
    *(ushort *)&this->isNull_ = (ushort)*(undefined4 *)&this->isNull_ & 0xfe00 | 4;
    (this->current_)._M_node = (_Base_ptr)local_20.cstr_;
  }
  else {
    Value::Value((Value *)this,local_20.cstr_);
  }
  Value::CZString::~CZString(&local_20);
  VVar1._8_8_ = extraout_RDX;
  VVar1.value_.map_ = (ObjectValues *)this;
  return VVar1;
}

Assistant:

Value
ValueIteratorBase::key () const
{
    const Value::CZString czstring = (*current_).first;

    if ( czstring.c_str () )
    {
        if ( czstring.isStaticString () )
            return Value ( StaticString ( czstring.c_str () ) );

        return Value ( czstring.c_str () );
    }

    return Value ( czstring.index () );
}